

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderMaxShaderStorageBlocksTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMaxShaderStorageBlocksTest *this)

{
  ostream *poVar1;
  GLint n_ssb_1;
  GLint n_ssb;
  int iVar2;
  char *gs_code_raw;
  string gs_code;
  stringstream code_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&code_sstream);
  std::operator<<(&local_1a8,
                  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nint counter = 0;\n\n"
                 );
  for (iVar2 = 0; iVar2 < this->m_gl_max_geometry_shader_storage_blocks_ext_value; iVar2 = iVar2 + 1
      ) {
    poVar1 = std::operator<<(&local_1a8,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,") buffer ssb");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1," \n{\n");
    poVar1 = std::operator<<(poVar1,"    int value;\n");
    poVar1 = std::operator<<(poVar1,"} S_SSB");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";\n\n");
  }
  std::operator<<(&local_1a8,"\nvoid main()\n{\n");
  for (iVar2 = 0; iVar2 < this->m_gl_max_geometry_shader_storage_blocks_ext_value; iVar2 = iVar2 + 1
      ) {
    poVar1 = std::operator<<(&local_1a8,"    counter += S_SSB");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,".value++;\n");
  }
  std::operator<<(&local_1a8,
                  "\n    gl_Position = vec4(float(counter), 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  gs_code_raw = gs_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&gs_code_raw);
  std::__cxx11::string::~string((string *)&gs_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&code_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMaxShaderStorageBlocksTest::getGSCode()
{
	std::stringstream code_sstream;

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"int counter = 0;\n"
					"\n";

	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		code_sstream << "layout(binding = " << n_ssb << ") buffer ssb" << n_ssb << " \n{\n"
					 << "    int value;\n"
					 << "} S_SSB" << n_ssb << ";\n\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		code_sstream << "    counter += S_SSB" << n_ssb << ".value++;\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(float(counter), 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1 /* parts */, &gs_code_raw);

	return gs_code_specialized;
}